

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O1

void __thiscall
ObjectIdentifier::GetNextLong(ObjectIdentifier *this,char *start,char **next,unsigned_long *out)

{
  ulong uVar1;
  char *pcVar2;
  invalid_argument *this_00;
  char *local_30;
  char *end;
  
  local_30 = (char *)0x0;
  uVar1 = strtoul(start,&local_30,10);
  if ((*local_30 == '\0') || (*local_30 == '.')) {
    if (start != local_30 || uVar1 != 0) {
      *out = uVar1;
      pcVar2 = (char *)0x0;
      if (*local_30 != '\0') {
        pcVar2 = local_30 + 1;
      }
      *next = pcVar2;
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Illegal OID");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Illegal OID");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void ObjectIdentifier::GetNextLong(const char * start, const char *& next, unsigned long & out)
{
	char* end = nullptr;
	unsigned long tmp = strtoul(start, &end, 10);

	// If end is an invalid character, then fail
	switch (*end)
	{
	case '.':
	case '\0':
		break;
	default:
		throw std::invalid_argument("Illegal OID");
	}

	// 0 is a legal OID value
	// but it is how strtoul returns an error, which we can tell if end == start
	// for example if we had "1..2"
	if (tmp == 0 && start == end)
		throw std::invalid_argument("Illegal OID");

	out = tmp;
	next = *end == '\0' ? nullptr : end + 1;
}